

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

void luaH_setint(lua_State *L,Table *t,lua_Integer key,TValue *value)

{
  TValue *io1;
  TValue *pTVar1;
  TValue *io2;
  TValue k;
  Value local_30;
  undefined1 local_28;
  
  pTVar1 = luaH_getint(t,key);
  if (pTVar1->tt_ == ' ') {
    local_28 = 3;
    local_30.i = key;
    luaH_newkey(L,t,(TValue *)&local_30,value);
  }
  else {
    pTVar1->value_ = value->value_;
    pTVar1->tt_ = value->tt_;
  }
  return;
}

Assistant:

void luaH_setint (lua_State *L, Table *t, lua_Integer key, TValue *value) {
  const TValue *p = luaH_getint(t, key);
  if (isabstkey(p)) {
    TValue k;
    setivalue(&k, key);
    luaH_newkey(L, t, &k, value);
  }
  else
    setobj2t(L, cast(TValue *, p), value);
}